

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostViolation
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  pointer pnVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  VarStatus VVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_78;
  cpp_dec_float<50U,_int,_void> *local_40;
  uint *local_38;
  
  bVar3 = this->_hasBasis;
  if (bVar3 == true) {
    local_40 = &sumviol->m_backend;
    if ((this->_hasSolRational == true) && (this->_hasSolReal == false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_40,0.0);
    lVar13 = (long)(this->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (0 < lVar13) {
      local_38 = (maxviol->m_backend).data._M_elems + 1;
      lVar14 = lVar13 * 0x38;
      do {
        VVar11 = basisColStatus(this,(int)(lVar13 + -1));
        if (this->_currentSettings->_intParamValues[0] == -1) {
          if (((VVar11 & ~FIXED) != ON_UPPER) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2)) {
            local_78.fpclass = cpp_dec_float_finite;
            local_78.prec_elem = 10;
            local_78.data._M_elems[0] = 0;
            local_78.data._M_elems[1] = 0;
            local_78.data._M_elems[2] = 0;
            local_78.data._M_elems[3] = 0;
            local_78.data._M_elems[4] = 0;
            local_78.data._M_elems[5] = 0;
            local_78.data._M_elems._24_5_ = 0;
            local_78.data._M_elems[7]._1_3_ = 0;
            local_78.data._M_elems[8] = 0;
            local_78.data._M_elems[9] = 0;
            local_78.exp = 0;
            local_78.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar14),&local_78);
            if (iVar12 < 0) {
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x20);
              local_78.data._M_elems[8] = (uint)uVar7;
              local_78.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
              puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14);
              local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x10);
              local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              uVar7 = *(undefined8 *)(puVar2 + 2);
              local_78.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x28);
              local_78.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x2c);
              local_78._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30);
              if (local_78.fpclass != cpp_dec_float_finite || local_78.data._M_elems[0] != 0) {
                local_78.neg = (bool)(local_78.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_40,&local_78);
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
              local_78.data._M_elems[8] = (uint)uVar7;
              local_78.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
              local_78.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
              local_78.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2)
              ;
              local_78.data._M_elems._16_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
              uVar7 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
              local_78.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.exp = (maxviol->m_backend).exp;
              local_78.neg = (maxviol->m_backend).neg;
              local_78.fpclass = (maxviol->m_backend).fpclass;
              local_78.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_78.data._M_elems[0] != 0 || local_78.fpclass != cpp_dec_float_finite) {
                local_78.neg = (bool)(local_78.neg ^ 1);
              }
              if (((local_78.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2)) &&
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar14),&local_78),
                 iVar12 < 0)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar5 = *(uint *)((long)&pnVar6[-1].m_backend.data + lVar14);
                local_78.data._M_elems[8] =
                     *(uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x24);
                puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x14);
                local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                uVar9 = *(undefined8 *)(puVar2 + 2);
                local_78.data._M_elems._24_5_ = SUB85(uVar9,0);
                local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
                puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 4);
                local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
                local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
                iVar12 = *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x28);
                uVar7 = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30);
                bVar4 = *(byte *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x2c);
                (maxviol->m_backend).data._M_elems[0] = uVar5;
                local_38[8] = local_78.data._M_elems[8];
                *(undefined8 *)(local_38 + 4) = local_78.data._M_elems._16_8_;
                *(undefined8 *)(local_38 + 6) = uVar9;
                *(undefined8 *)local_38 = local_78.data._M_elems._0_8_;
                *(undefined8 *)(local_38 + 2) = local_78.data._M_elems._8_8_;
                (maxviol->m_backend).exp = iVar12;
                (maxviol->m_backend).neg = (bool)((uVar5 != 0 || (int)uVar7 != 0) ^ bVar4);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
          if ((VVar11 - ZERO < 0xfffffffe) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2)) {
            local_78.fpclass = cpp_dec_float_finite;
            local_78.prec_elem = 10;
            local_78.data._M_elems[0] = 0;
            local_78.data._M_elems[1] = 0;
            local_78.data._M_elems[2] = 0;
            local_78.data._M_elems[3] = 0;
            local_78.data._M_elems[4] = 0;
            local_78.data._M_elems[5] = 0;
            local_78.data._M_elems._24_5_ = 0;
            local_78.data._M_elems[7]._1_3_ = 0;
            local_78.data._M_elems[8] = 0;
            local_78.data._M_elems[9] = 0;
            local_78.exp = 0;
            local_78.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar14),&local_78);
            if (0 < iVar12) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_40,(cpp_dec_float<50U,_int,_void> *)
                                  ((long)&(this->_solReal)._redCost.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + lVar14));
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar14),
                                      &maxviol->m_backend), 0 < iVar12)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) =
                     *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x20);
                puVar1 = (undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14);
                uVar7 = *puVar1;
                uVar9 = puVar1[1];
                puVar1 = (undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x10);
                uVar10 = puVar1[1];
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = *puVar1;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = uVar10;
                *(undefined8 *)(maxviol->m_backend).data._M_elems = uVar7;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = uVar9;
                (maxviol->m_backend).exp =
                     *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x28);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x2c);
                uVar7 = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
        }
        else {
          if (((VVar11 & ~FIXED) != ON_UPPER) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2)) {
            local_78.fpclass = cpp_dec_float_finite;
            local_78.prec_elem = 10;
            local_78.data._M_elems[0] = 0;
            local_78.data._M_elems[1] = 0;
            local_78.data._M_elems[2] = 0;
            local_78.data._M_elems[3] = 0;
            local_78.data._M_elems[4] = 0;
            local_78.data._M_elems[5] = 0;
            local_78.data._M_elems._24_5_ = 0;
            local_78.data._M_elems[7]._1_3_ = 0;
            local_78.data._M_elems[8] = 0;
            local_78.data._M_elems[9] = 0;
            local_78.exp = 0;
            local_78.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar14),&local_78);
            if (0 < iVar12) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_40,(cpp_dec_float<50U,_int,_void> *)
                                  ((long)&(this->_solReal)._redCost.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data + lVar14));
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2) &&
                  ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar14),
                                      &maxviol->m_backend), 0 < iVar12)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) =
                     *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x20);
                puVar1 = (undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14);
                uVar7 = *puVar1;
                uVar9 = puVar1[1];
                puVar1 = (undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x10);
                uVar10 = puVar1[1];
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = *puVar1;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = uVar10;
                *(undefined8 *)(maxviol->m_backend).data._M_elems = uVar7;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = uVar9;
                (maxviol->m_backend).exp =
                     *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x28);
                (maxviol->m_backend).neg =
                     *(bool *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x2c);
                uVar7 = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
          if ((VVar11 - ZERO < 0xfffffffe) &&
             (pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2)) {
            local_78.fpclass = cpp_dec_float_finite;
            local_78.prec_elem = 10;
            local_78.data._M_elems[0] = 0;
            local_78.data._M_elems[1] = 0;
            local_78.data._M_elems[2] = 0;
            local_78.data._M_elems[3] = 0;
            local_78.data._M_elems[4] = 0;
            local_78.data._M_elems[5] = 0;
            local_78.data._M_elems._24_5_ = 0;
            local_78.data._M_elems[7]._1_3_ = 0;
            local_78.data._M_elems[8] = 0;
            local_78.data._M_elems[9] = 0;
            local_78.exp = 0;
            local_78.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_78,0.0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)&pnVar6[-1].m_backend.data + lVar14),&local_78);
            if (iVar12 < 0) {
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x20);
              local_78.data._M_elems[8] = (uint)uVar7;
              local_78.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
              puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14);
              local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x10);
              local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              uVar7 = *(undefined8 *)(puVar2 + 2);
              local_78.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x28);
              local_78.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x2c);
              local_78._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30);
              if (local_78.fpclass != cpp_dec_float_finite || local_78.data._M_elems[0] != 0) {
                local_78.neg = (bool)(local_78.neg ^ 1);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_40,&local_78);
              pnVar6 = (this->_solReal)._redCost.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar7 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
              local_78.data._M_elems[8] = (uint)uVar7;
              local_78.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
              local_78.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
              local_78.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2)
              ;
              local_78.data._M_elems._16_8_ =
                   *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
              uVar7 = *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
              local_78.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.exp = (maxviol->m_backend).exp;
              local_78.neg = (maxviol->m_backend).neg;
              local_78.fpclass = (maxviol->m_backend).fpclass;
              local_78.prec_elem = (maxviol->m_backend).prec_elem;
              if (local_78.data._M_elems[0] != 0 || local_78.fpclass != cpp_dec_float_finite) {
                local_78.neg = (bool)(local_78.neg ^ 1);
              }
              if (((local_78.fpclass != cpp_dec_float_NaN) &&
                  (*(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30) != 2)) &&
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)&pnVar6[-1].m_backend.data + lVar14),&local_78),
                 iVar12 < 0)) {
                pnVar6 = (this->_solReal)._redCost.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar5 = *(uint *)((long)&pnVar6[-1].m_backend.data + lVar14);
                local_78.data._M_elems[8] =
                     *(uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x24);
                puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x14);
                local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                uVar9 = *(undefined8 *)(puVar2 + 2);
                local_78.data._M_elems._24_5_ = SUB85(uVar9,0);
                local_78.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
                puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar14 + 4);
                local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
                local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
                iVar12 = *(int *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x28);
                uVar7 = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x30);
                bVar4 = *(byte *)((long)&pnVar6[-1].m_backend.data + lVar14 + 0x2c);
                (maxviol->m_backend).data._M_elems[0] = uVar5;
                local_38[8] = local_78.data._M_elems[8];
                *(undefined8 *)(local_38 + 4) = local_78.data._M_elems._16_8_;
                *(undefined8 *)(local_38 + 6) = uVar9;
                *(undefined8 *)local_38 = local_78.data._M_elems._0_8_;
                *(undefined8 *)(local_38 + 2) = local_78.data._M_elems._8_8_;
                (maxviol->m_backend).exp = iVar12;
                (maxviol->m_backend).neg = (bool)((uVar5 != 0 || (int)uVar7 != 0) ^ bVar4);
                (maxviol->m_backend).fpclass = (int)uVar7;
                (maxviol->m_backend).prec_elem = (int)((ulong)uVar7 >> 0x20);
              }
            }
          }
        }
        bVar8 = 1 < lVar13;
        lVar13 = lVar13 + -1;
        lVar14 = lVar14 + -0x38;
      } while (bVar8);
    }
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::getRedCostViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& redcost = _solReal._redCost;
   assert(redcost.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int c = numCols() - 1; c >= 0; c--)
   {
      typename SPxSolverBase<R>::VarStatus colStatus = basisColStatus(c);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }
      }
      else
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }
      }
   }

   return true;
}